

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS ref_iso_boom_header(FILE **file_ptr,REF_INT ldim,char **scalar_names,char *filename)

{
  FILE *pFVar1;
  int local_34;
  REF_INT i;
  char *filename_local;
  char **scalar_names_local;
  REF_INT ldim_local;
  FILE **file_ptr_local;
  
  pFVar1 = fopen(filename,"w");
  *file_ptr = (FILE *)pFVar1;
  if (*file_ptr == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
  }
  if (*file_ptr == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x31c,
           "ref_iso_boom_header","unable to open file");
    file_ptr_local._4_4_ = 2;
  }
  else {
    fprintf((FILE *)*file_ptr,"title=\"tecplot refine gather\"\n");
    fprintf((FILE *)*file_ptr,"variables = \"x\" \"y\" \"z\"");
    if (scalar_names == (char **)0x0) {
      for (local_34 = 0; local_34 < ldim; local_34 = local_34 + 1) {
        fprintf((FILE *)*file_ptr," \"V%d\"",(ulong)(local_34 + 1));
      }
    }
    else {
      for (local_34 = 0; local_34 < ldim; local_34 = local_34 + 1) {
        fprintf((FILE *)*file_ptr," \"%s\"",scalar_names[local_34]);
      }
    }
    fprintf((FILE *)*file_ptr,"\n");
    file_ptr_local._4_4_ = 0;
  }
  return file_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boom_header(FILE **file_ptr, REF_INT ldim,
                                       const char **scalar_names,
                                       const char *filename) {
  REF_INT i;
  *file_ptr = fopen(filename, "w");
  if (NULL == ((void *)*file_ptr)) printf("unable to open %s\n", filename);
  RNS(*file_ptr, "unable to open file");
  fprintf(*file_ptr, "title=\"tecplot refine gather\"\n");
  fprintf(*file_ptr, "variables = \"x\" \"y\" \"z\"");
  if (NULL != scalar_names) {
    for (i = 0; i < ldim; i++) fprintf(*file_ptr, " \"%s\"", scalar_names[i]);
  } else {
    for (i = 0; i < ldim; i++) fprintf(*file_ptr, " \"V%d\"", i + 1);
  }
  fprintf(*file_ptr, "\n");

  return REF_SUCCESS;
}